

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::LocalStructTests::init()::Eval_conditional_assignment::eval(deqp::gls
     ::ShaderEvalContext__(ShaderEvalContext *c)

{
  ulong uVar1;
  long lVar2;
  float afStack_2c [3];
  ulong local_20;
  int local_18 [6];
  
  uVar1 = *(ulong *)((c->coords).m_data + 1);
  afStack_2c[2] = (c->coords).m_data[3];
  local_20 = uVar1 << 0x20 | uVar1 >> 0x20;
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar2 = 2;
  do {
    (c->color).m_data[local_18[lVar2]] = afStack_2c[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }